

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall
tonk::HostnameResolverState::InitializeResolvedAddressList
          (HostnameResolverState *this,results_type *results)

{
  long lVar1;
  pointer paVar2;
  long lVar3;
  uint uVar4;
  uint64_t uVar5;
  byte bVar6;
  ulong uVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  address local_50;
  
  paVar2 = (this->ResolvedIPAddresses).
           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ResolvedIPAddresses).
      super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar2) {
    (this->ResolvedIPAddresses).
    super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar2;
  }
  peVar8 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::reserve
            (&this->ResolvedIPAddresses,
             ((long)*(pointer *)
                     ((long)&(peVar8->
                             super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                             )._M_impl.super__Vector_impl_data + 8) -
              *(long *)&(peVar8->
                        super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                        )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555);
  peVar8 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
            super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar8 != (element_type *)0x0) {
    lVar9 = 0;
    this_01 = this_00;
    do {
      lVar3 = *(long *)&(peVar8->
                        super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                        )._M_impl.super__Vector_impl_data;
      lVar1 = lVar3 + lVar9 * 0x60;
      if (*(short *)(lVar3 + lVar9 * 0x60) == 2) {
        local_50._0_8_ = (ulong)*(uint *)(lVar1 + 4) << 0x20;
        local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_50.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_50.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar1 + 0x18);
        local_50.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(lVar1 + 8);
        local_50.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(lVar1 + 0x10);
        local_50.type_ = ipv6;
        local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
      std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::
      emplace_back<asio::ip::address>(&this->ResolvedIPAddresses,&local_50);
      lVar9 = lVar9 + 1;
      this_00 = this_01;
      if (lVar9 == ((long)*(pointer *)
                           ((long)&(peVar8->
                                   super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                                   )._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(peVar8->
                              super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                              )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555) {
        peVar8 = (element_type *)0x0;
        lVar9 = 0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          peVar8 = (element_type *)0x0;
          lVar9 = 0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
      }
      this_01 = this_00;
    } while (peVar8 != (element_type *)0x0);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->ConnectRequestsRemaining =
       (uint)((ulong)((long)(this->ResolvedIPAddresses).
                            super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->ResolvedIPAddresses).
                           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  uVar5 = siamese::GetTimeUsec();
  uVar7 = uVar5 * -0x4f5c17a566d501a4 + 0x5851f42d4c957f2e;
  uVar4 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
  bVar6 = (byte)(uVar7 >> 0x3b);
  this->ConnectAddrIndex = (uVar4 >> bVar6 | uVar4 << 0x20 - bVar6) % this->ConnectRequestsRemaining
  ;
  return;
}

Assistant:

void HostnameResolverState::InitializeResolvedAddressList(
    const asio::ip::tcp::resolver::results_type& results)
{
    // Copy the resolved addresses
    ResolvedIPAddresses.clear();
    ResolvedIPAddresses.reserve(results.size());
    for (const auto& result : results) {
        ResolvedIPAddresses.emplace_back(result.endpoint().address());
    }
    ConnectRequestsRemaining = (unsigned)ResolvedIPAddresses.size();

    // Select the first address to connect to at random
    siamese::PCGRandom prng;
    prng.Seed(siamese::GetTimeUsec());
    ConnectAddrIndex = static_cast<int>(prng.Next() % ConnectRequestsRemaining);
}